

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

void __thiscall
QGraphicsScene::dragMoveEvent(QGraphicsScene *this,QGraphicsSceneDragDropEvent *event)

{
  QGraphicsScenePrivate *this_00;
  QGraphicsItem *this_01;
  QGraphicsItem **ppQVar1;
  bool bVar2;
  DropAction DVar3;
  QWidget *widget;
  QGraphicsScenePrivate *pQVar4;
  long lVar5;
  long lVar6;
  long in_FS_OFFSET;
  QPointF QVar7;
  undefined1 local_98 [16];
  undefined1 *local_88;
  undefined1 local_78 [16];
  QScopedPointer<QGraphicsSceneEventPrivate,_QScopedPointerDeleter<QGraphicsSceneEventPrivate>_>
  local_68;
  QArrayDataPointer<QGraphicsItem_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsScenePrivate **)(this + 8);
  (event->super_QGraphicsSceneEvent).field_0xc = 0;
  if ((this_00->mouseGrabberItems).d.size != 0) {
    QGraphicsScenePrivate::clearMouseGrabber(this_00);
    QMap<Qt::MouseButton,_QPointF>::clear(&this_00->mouseGrabberButtonDownPos);
    QMap<Qt::MouseButton,_QPointF>::clear(&this_00->mouseGrabberButtonDownScenePos);
    QMap<Qt::MouseButton,_QPoint>::clear(&this_00->mouseGrabberButtonDownScreenPos);
  }
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
  local_98._0_8_ = QGraphicsSceneDragDropEvent::screenPos(event);
  QVar7 = QGraphicsSceneDragDropEvent::scenePos(event);
  local_78._8_8_ = QVar7.yp;
  local_78._0_8_ = QVar7.xp;
  widget = QGraphicsSceneEvent::widget(&event->super_QGraphicsSceneEvent);
  QGraphicsScenePrivate::itemsAtPosition
            ((QList<QGraphicsItem_*> *)&local_58,this_00,(QPoint *)local_98,(QPointF *)local_78,
             widget);
  ppQVar1 = local_58.ptr;
  lVar5 = local_58.size << 3;
  lVar6 = 0;
  do {
    if (lVar5 == lVar6) {
      if (this_00->dragDropItem != (QGraphicsItem *)0x0) {
        local_68.d = (QGraphicsSceneEventPrivate *)&DAT_aaaaaaaaaaaaaaaa;
        local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        pQVar4 = (QGraphicsScenePrivate *)local_78;
        QGraphicsSceneDragDropEvent::QGraphicsSceneDragDropEvent
                  ((QGraphicsSceneDragDropEvent *)local_78,GraphicsSceneDragLeave);
        QGraphicsScenePrivate::cloneDragDropEvent
                  (pQVar4,(QGraphicsSceneDragDropEvent *)local_78,event);
        QGraphicsScenePrivate::sendDragDropEvent
                  (this_00,this_00->dragDropItem,(QGraphicsSceneDragDropEvent *)local_78);
        this_00->dragDropItem = (QGraphicsItem *)0x0;
        QGraphicsSceneHelpEvent::~QGraphicsSceneHelpEvent((QGraphicsSceneHelpEvent *)local_78);
      }
      QGraphicsSceneDragDropEvent::setDropAction(event,IgnoreAction);
LAB_0059b282:
      QArrayDataPointer<QGraphicsItem_*>::~QArrayDataPointer(&local_58);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
    this_01 = *(QGraphicsItem **)((long)ppQVar1 + lVar6);
    bVar2 = QGraphicsItem::isEnabled(this_01);
    if (bVar2) {
      bVar2 = QGraphicsItem::acceptDrops(this_01);
      if (bVar2) {
        if (this_01 != this_00->dragDropItem) {
          local_68.d = (QGraphicsSceneEventPrivate *)&DAT_aaaaaaaaaaaaaaaa;
          local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          pQVar4 = (QGraphicsScenePrivate *)local_78;
          QGraphicsSceneDragDropEvent::QGraphicsSceneDragDropEvent
                    ((QGraphicsSceneDragDropEvent *)local_78,GraphicsSceneDragEnter);
          QGraphicsScenePrivate::cloneDragDropEvent
                    (pQVar4,(QGraphicsSceneDragDropEvent *)local_78,event);
          DVar3 = QGraphicsSceneDragDropEvent::proposedAction(event);
          QGraphicsSceneDragDropEvent::setDropAction((QGraphicsSceneDragDropEvent *)local_78,DVar3);
          QGraphicsScenePrivate::sendDragDropEvent
                    (this_00,this_01,(QGraphicsSceneDragDropEvent *)local_78);
          (**(code **)(*(long *)&event->super_QGraphicsSceneEvent + 0x10))(event,local_78[0xc]);
          DVar3 = QGraphicsSceneDragDropEvent::dropAction((QGraphicsSceneDragDropEvent *)local_78);
          QGraphicsSceneDragDropEvent::setDropAction(event,DVar3);
          if ((event->super_QGraphicsSceneEvent).field_0xc != '\x01') {
            QGraphicsSceneHelpEvent::~QGraphicsSceneHelpEvent((QGraphicsSceneHelpEvent *)local_78);
            goto LAB_0059b203;
          }
          DVar3 = QGraphicsSceneDragDropEvent::dropAction(event);
          this_00->lastDropAction = DVar3;
          if (this_00->dragDropItem != (QGraphicsItem *)0x0) {
            local_88 = &DAT_aaaaaaaaaaaaaaaa;
            local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            pQVar4 = (QGraphicsScenePrivate *)local_98;
            QGraphicsSceneDragDropEvent::QGraphicsSceneDragDropEvent
                      ((QGraphicsSceneDragDropEvent *)local_98,GraphicsSceneDragLeave);
            QGraphicsScenePrivate::cloneDragDropEvent
                      (pQVar4,(QGraphicsSceneDragDropEvent *)local_98,event);
            QGraphicsScenePrivate::sendDragDropEvent
                      (this_00,this_00->dragDropItem,(QGraphicsSceneDragDropEvent *)local_98);
            QGraphicsSceneHelpEvent::~QGraphicsSceneHelpEvent((QGraphicsSceneHelpEvent *)local_98);
          }
          this_00->dragDropItem = this_01;
          QGraphicsSceneHelpEvent::~QGraphicsSceneHelpEvent((QGraphicsSceneHelpEvent *)local_78);
        }
        QGraphicsSceneDragDropEvent::setDropAction(event,this_00->lastDropAction);
        (event->super_QGraphicsSceneEvent).field_0xc = 1;
        QGraphicsScenePrivate::sendDragDropEvent(this_00,this_01,event);
        if ((event->super_QGraphicsSceneEvent).field_0xc == '\x01') {
          DVar3 = QGraphicsSceneDragDropEvent::dropAction(event);
          this_00->lastDropAction = DVar3;
        }
        goto LAB_0059b282;
      }
    }
LAB_0059b203:
    lVar6 = lVar6 + 8;
  } while( true );
}

Assistant:

void QGraphicsScene::dragMoveEvent(QGraphicsSceneDragDropEvent *event)
{
    Q_D(QGraphicsScene);
    event->ignore();

    if (!d->mouseGrabberItems.isEmpty()) {
        // Mouse grabbers that start drag events lose the mouse grab.
        d->clearMouseGrabber();
        d->mouseGrabberButtonDownPos.clear();
        d->mouseGrabberButtonDownScenePos.clear();
        d->mouseGrabberButtonDownScreenPos.clear();
    }

    bool eventDelivered = false;

    // Find the topmost enabled items under the cursor. They are all
    // candidates for accepting drag & drop events.
    const auto items = d->itemsAtPosition(event->screenPos(),
                                          event->scenePos(),
                                          event->widget());
    for (QGraphicsItem *item : items) {
        if (!item->isEnabled() || !item->acceptDrops())
            continue;

        if (item != d->dragDropItem) {
            // Enter the new drag drop item. If it accepts the event, we send
            // the leave to the parent item.
            QGraphicsSceneDragDropEvent dragEnter(QEvent::GraphicsSceneDragEnter);
            d->cloneDragDropEvent(&dragEnter, event);
            dragEnter.setDropAction(event->proposedAction());
            d->sendDragDropEvent(item, &dragEnter);
            event->setAccepted(dragEnter.isAccepted());
            event->setDropAction(dragEnter.dropAction());
            if (!event->isAccepted()) {
                // Propagate to the item under
                continue;
            }

            d->lastDropAction = event->dropAction();

            if (d->dragDropItem) {
                // Leave the last drag drop item. A perfect implementation
                // would set the position of this event to the point where
                // this event and the last event intersect with the item's
                // shape, but that's not easy to do. :-)
                QGraphicsSceneDragDropEvent dragLeave(QEvent::GraphicsSceneDragLeave);
                d->cloneDragDropEvent(&dragLeave, event);
                d->sendDragDropEvent(d->dragDropItem, &dragLeave);
            }

            // We've got a new drag & drop item
            d->dragDropItem = item;
        }

        // Send the move event.
        event->setDropAction(d->lastDropAction);
        event->accept();
        d->sendDragDropEvent(item, event);
        if (event->isAccepted())
            d->lastDropAction = event->dropAction();
        eventDelivered = true;
        break;
    }

    if (!eventDelivered) {
        if (d->dragDropItem) {
            // Leave the last drag drop item
            QGraphicsSceneDragDropEvent dragLeave(QEvent::GraphicsSceneDragLeave);
            d->cloneDragDropEvent(&dragLeave, event);
            d->sendDragDropEvent(d->dragDropItem, &dragLeave);
            d->dragDropItem = nullptr;
        }
        // Propagate
        event->setDropAction(Qt::IgnoreAction);
    }
}